

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O0

int anon_unknown.dwarf_28f2::forward_query_fn(void *extra_state,MPI_Status *status)

{
  code *pcVar1;
  undefined8 uVar2;
  int iVar3;
  MPIABI_Status *pMVar4;
  WPI_StatusPtr local_28;
  void *local_20;
  grequest_state_t *grequest_state;
  MPI_Status *status_local;
  void *extra_state_local;
  
  pcVar1 = *extra_state;
  uVar2 = *(undefined8 *)((long)extra_state + 0x18);
  local_20 = extra_state;
  grequest_state = (grequest_state_t *)status;
  status_local = (MPI_Status *)extra_state;
  WPI_StatusPtr::WPI_StatusPtr(&local_28,status);
  pMVar4 = WPI_StatusPtr::operator_cast_to_MPIABI_Status_(&local_28);
  iVar3 = (*pcVar1)(uVar2,pMVar4);
  WPI_StatusPtr::~WPI_StatusPtr(&local_28);
  return iVar3;
}

Assistant:

int forward_query_fn(void *extra_state, MPI_Status *status) {
  const grequest_state_t *const grequest_state =
      static_cast<const grequest_state_t *>(extra_state);
  return grequest_state->query_fn(grequest_state->extra_state,
                                  (WPI_StatusPtr)status);
}